

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double derivative_in_direction<dense_parameters>
                 (vw *param_1,bfgs *b,float *mem,int *origin,dense_parameters *weights)

{
  byte bVar1;
  long lVar2;
  double dVar3;
  
  bVar1 = (byte)weights->_stride_shift;
  dVar3 = 0.0;
  for (lVar2 = 0; weights->_weight_mask * 4 + 4 != lVar2; lVar2 = lVar2 + (1L << (bVar1 & 0x3f)) * 4
      ) {
    dVar3 = dVar3 + (double)*(float *)((long)weights->_begin + lVar2 + 8) *
                    (double)mem[((ulong)(lVar2 >> 2) >> (bVar1 & 0x3f)) * (long)b->mem_stride +
                                (long)(*origin % b->mem_stride)];
  }
  return dVar3;
}

Assistant:

double derivative_in_direction(vw& /* all */, bfgs& b, float* mem, int& origin, T& weights)
{
  double ret = 0.;
  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    float* mem1 = mem + (w.index() >> weights.stride_shift()) * b.mem_stride;
    ret += ((double)mem1[(MEM_GT + origin) % b.mem_stride]) * (&(*w))[W_DIR];
  }
  return ret;
}